

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clGetGLContextInfoKHR
                 (cl_context_properties *properties,cl_gl_context_info param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  uint64_t enqueueCounter_00;
  CLIntercept *this;
  bool bVar1;
  cl_int cVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  void *in_RCX;
  size_t in_RDX;
  cl_gl_context_info in_ESI;
  cl_context_properties *in_RDI;
  size_t *in_R8;
  cl_int in_stack_000000c4;
  char *in_stack_000000c8;
  cl_int retVal;
  CLIntercept *in_stack_000000d0;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  CLIntercept *in_stack_fffffffffffffeb8;
  cl_int in_stack_fffffffffffffef4;
  CEnumNameMap *in_stack_fffffffffffffef8;
  allocator local_f1;
  string local_f0 [16];
  cl_sync_point_khr *in_stack_ffffffffffffff20;
  cl_event *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  time_point tVar7;
  cl_int errorCode;
  char *in_stack_ffffffffffffff38;
  CLIntercept *in_stack_ffffffffffffff40;
  string local_b8 [7];
  undefined1 in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  time_point in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  time_point in_stack_ffffffffffffff78;
  char *local_78;
  string local_60 [32];
  uint64_t local_40;
  CLIntercept *local_38;
  size_t *local_30;
  void *local_28;
  size_t local_20;
  cl_gl_context_info local_14;
  cl_context_properties *local_10;
  cl_int local_4;
  
  errorCode = (cl_int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_38),
     pcVar3->clGetGLContextInfoKHR == (cl_api_clGetGLContextInfoKHR)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffef4)
    ;
    local_4 = -0x20;
  }
  else {
    local_40 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffeb8);
    pSVar4 = CLIntercept::config(local_38);
    this = local_38;
    enqueueCounter_00 = local_40;
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::enumName(local_38);
      CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      uVar5 = std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (this,"clGetGLContextInfoKHR",enqueueCounter_00,(cl_kernel)0x0,
                 "param_name = %s (%08X)",uVar5,CONCAT44(uVar6,local_14));
      std::__cxx11::string::~string(local_60);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_78 = (char *)in_stack_ffffffffffffff78.__d.__r;
    }
    pcVar3 = CLIntercept::dispatch(local_38);
    cVar2 = (*pcVar3->clGetGLContextInfoKHR)(local_10,local_14,local_20,local_28,local_30);
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      tVar7.__d.__r = in_stack_ffffffffffffff68.__d.__r;
      pSVar4 = CLIntercept::config(local_38);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_40), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"",(allocator *)&stack0xffffffffffffff47);
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)CONCAT44(cVar2,in_stack_ffffffffffffff70),
                   (char *)in_stack_ffffffffffffff68.__d.__r,(string *)in_stack_ffffffffffffff60,
                   tVar7,in_stack_ffffffffffffff78);
        errorCode = (cl_int)((ulong)tVar7.__d.__r >> 0x20);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
        in_stack_ffffffffffffff38 = local_78;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_38), (pSVar4->NoErrors & 1U) != 0)) && (cVar2 != 0)) {
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->NoErrors & 1U) != 0) {
        cVar2 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,errorCode,
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
    pSVar4 = CLIntercept::config(local_38);
    local_4 = cVar2;
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"",&local_f1);
      tVar7.__d.__r._4_4_ = cVar2;
      tVar7.__d.__r._0_4_ = in_stack_ffffffffffffff70;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (bool)in_stack_ffffffffffffff4f,(uint64_t)in_stack_ffffffffffffff40,tVar7,
                 in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      local_4 = cVar2;
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetGLContextInfoKHR(
    const cl_context_properties *properties,
    cl_gl_context_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clGetGLContextInfoKHR )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "param_name = %s (%08X)",
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetGLContextInfoKHR(
            properties,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret);

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_PLATFORM);
}